

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

SpecialProperties Catch::parseSpecialTag(string *tag)

{
  bool bVar1;
  allocator local_39;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_38,".",&local_39);
  bVar1 = startsWith(tag,&local_38);
  if ((bVar1) || (bVar1 = std::operator==(tag,"hide"), bVar1)) {
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    bVar1 = std::operator==(tag,"!hide");
    std::__cxx11::string::~string((string *)&local_38);
    if (!bVar1) {
      bVar1 = std::operator==(tag,"!throws");
      if (bVar1) {
        return Throws;
      }
      bVar1 = std::operator==(tag,"!shouldfail");
      if (bVar1) {
        return ShouldFail;
      }
      bVar1 = std::operator==(tag,"!mayfail");
      return (uint)bVar1 << 3;
    }
  }
  return IsHidden;
}

Assistant:

inline TestCaseInfo::SpecialProperties parseSpecialTag( std::string const& tag ) {
        if( startsWith( tag, "." ) ||
            tag == "hide" ||
            tag == "!hide" )
            return TestCaseInfo::IsHidden;
        else if( tag == "!throws" )
            return TestCaseInfo::Throws;
        else if( tag == "!shouldfail" )
            return TestCaseInfo::ShouldFail;
        else if( tag == "!mayfail" )
            return TestCaseInfo::MayFail;
        else
            return TestCaseInfo::None;
    }